

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O2

void __thiscall Am_Priority_List::Delete(Am_Priority_List *this)

{
  Am_Priority_List_Item *item;
  
  item = this->current;
  if (item != (Am_Priority_List_Item *)0x0) {
    take_out_item(this,item);
    Am_Object::~Am_Object(&item->obj);
    operator_delete(item);
    return;
  }
  Am_Error("Call to Delete on priority list but no current item");
}

Assistant:

void
Am_Priority_List::Delete()
{
  if (current) {
    Am_Priority_List_Item *item = current;
    this->take_out_item(item); //will adjust current pointer
    delete item;
  } else
    Am_Error("Call to Delete on priority list but no current item");
}